

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitsUtils.cpp
# Opt level: O0

void ReadSingleFileWithDigits
               (string *path,
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *samples,vector<float,_std::allocator<float>_> *targets)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  reference pvVar4;
  value_type local_420;
  float local_41c;
  float label;
  vector<float,_std::allocator<float>_> params;
  string param;
  stringstream local_3e0 [8];
  stringstream ss;
  ostream local_3d0 [376];
  string local_258 [8];
  string line;
  istream local_228 [8];
  ifstream file;
  vector<float,_std::allocator<float>_> *targets_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *samples_local;
  string *path_local;
  
  std::ifstream::ifstream(local_228,path,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string(local_258);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_228,local_258,'\n');
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::stringstream::stringstream(local_3e0);
      std::operator<<(local_3d0,local_258);
      std::__cxx11::string::string
                ((string *)
                 &params.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&label);
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_3e0,
                            (string *)
                            &params.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,',');
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
        if (!bVar2) break;
        local_41c = std::__cxx11::stof((string *)
                                       &params.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (size_t *)0x0);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&label,&local_41c);
      }
      pvVar4 = std::vector<float,_std::allocator<float>_>::back
                         ((vector<float,_std::allocator<float>_> *)&label);
      local_420 = *pvVar4;
      std::vector<float,_std::allocator<float>_>::pop_back
                ((vector<float,_std::allocator<float>_> *)&label);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back(samples,(vector<float,_std::allocator<float>_> *)&label);
      std::vector<float,_std::allocator<float>_>::push_back(targets,&local_420);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)&label);
      std::__cxx11::string::~string
                ((string *)
                 &params.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::stringstream::~stringstream(local_3e0);
    }
    std::__cxx11::string::~string(local_258);
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void ReadSingleFileWithDigits( const std::string &path, std::vector<SPIKING_NN::Sample> &samples,
                               std::vector<float> &targets )
{
    std::ifstream file( path );
    if ( file.is_open()) {
        std::string line;
        while ( std::getline( file, line, '\n' )) {
            std::stringstream ss;
            ss << line;
            std::string param;
            std::vector<float> params;
            while ( std::getline( ss, param, ',' )) {
                params.push_back( std::stof( param ));
            }
            float label = params.back();
            params.pop_back();
            samples.push_back( params );
            targets.push_back( label );
        }
    }
}